

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

Matrix44<double> * Imath_3_2::outerProduct<double>(Vec4<double> *a,Vec4<double> *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Matrix44<double> *in_RDI;
  double dVar9;
  
  dVar4 = a->x;
  dVar1 = a->y;
  dVar2 = a->z;
  dVar5 = b->x;
  dVar6 = b->y;
  dVar3 = a->w;
  in_RDI->x[0][0] = dVar4 * dVar5;
  in_RDI->x[0][1] = dVar4 * dVar6;
  dVar7 = b->z;
  dVar8 = b->w;
  dVar9 = dVar4 * dVar8;
  in_RDI->x[0][2] = dVar4 * dVar7;
  in_RDI->x[0][3] = dVar9;
  in_RDI->x[1][0] = dVar1 * dVar5;
  in_RDI->x[1][1] = dVar1 * dVar6;
  in_RDI->x[1][2] = dVar7 * dVar1;
  in_RDI->x[1][3] = dVar9;
  in_RDI->x[2][0] = dVar2 * dVar5;
  in_RDI->x[2][1] = dVar2 * dVar6;
  in_RDI->x[2][2] = dVar7 * dVar2;
  in_RDI->x[2][3] = dVar9;
  in_RDI->x[3][0] = dVar5 * dVar3;
  in_RDI->x[3][1] = dVar6 * dVar3;
  in_RDI->x[3][2] = dVar3 * dVar7;
  in_RDI->x[3][3] = dVar3 * dVar8;
  return in_RDI;
}

Assistant:

Matrix44<T>
outerProduct (const Vec4<T>& a, const Vec4<T>& b)
{
    return Matrix44<T> (
        a.x * b.x,
        a.x * b.y,
        a.x * b.z,
        a.x * b.w,
        a.y * b.x,
        a.y * b.y,
        a.y * b.z,
        a.x * b.w,
        a.z * b.x,
        a.z * b.y,
        a.z * b.z,
        a.x * b.w,
        a.w * b.x,
        a.w * b.y,
        a.w * b.z,
        a.w * b.w);
}